

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * c4::detail::arealloc_impl(void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  void *__dest;
  size_t in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t min;
  void *tmp;
  bool local_59;
  void *local_58;
  size_t in_stack_ffffffffffffffb8;
  
  __dest = aalloc(in_RCX,in_stack_ffffffffffffffb8);
  local_58 = in_RSI;
  if (in_RDX < in_RSI) {
    local_58 = in_RDX;
  }
  local_59 = in_RDI < (void *)((long)__dest + (long)in_RDX) &&
             __dest < (void *)((long)in_RDI + (long)in_RSI);
  if (local_59) {
    memmove(__dest,in_RDI,(size_t)local_58);
  }
  else {
    memcpy(__dest,in_RDI,(size_t)local_58);
  }
  afree(local_58);
  return __dest;
}

Assistant:

void* arealloc_impl(void* ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    /** @todo make this more efficient
     * @see https://stackoverflow.com/questions/9078259/does-realloc-keep-the-memory-alignment-of-posix-memalign
     * @see look for qReallocAligned() in http://code.qt.io/cgit/qt/qtbase.git/tree/src/corelib/global/qmalloc.cpp
     */
    void *tmp = aalloc(newsz, alignment);
    size_t min = newsz < oldsz ? newsz : oldsz;
    if(mem_overlaps(ptr, tmp, oldsz, newsz))
    {
        ::memmove(tmp, ptr, min);
    }
    else
    {
        ::memcpy(tmp, ptr, min);
    }
    afree(ptr);
    return tmp;
}